

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_map.c
# Opt level: O3

_nhr_map_node * nhr_map_last(_nhr_map_node *map)

{
  _nhr_map_node *p_Var1;
  _nhr_map_node *cur;
  
  if (map != (_nhr_map_node *)0x0) {
    do {
      p_Var1 = map;
      map = map->next;
    } while (map != (_nhr_map_node_struct *)0x0);
    return p_Var1;
  }
  return (_nhr_map_node *)0x0;
}

Assistant:

_nhr_map_node * nhr_map_last(_nhr_map_node * map) {
	_nhr_map_node *cur = map, *last = map;
	while (cur) {
		last = cur;
		cur = cur->next;
	}
	return last;
}